

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O3

psa_status_t
psa_mac_setup(psa_mac_operation_t *operation,psa_key_handle_t handle,psa_algorithm_t alg,int is_sign
             )

{
  psa_status_t pVar1;
  int iVar2;
  mbedtls_cipher_info_t *cipher_info;
  ulong key_bits;
  uint uVar3;
  psa_key_slot_t *slot;
  psa_key_slot_t *local_38;
  
  if (operation->alg != 0) {
    return -0x89;
  }
  uVar3 = alg & 0xffffc0ff;
  operation->alg = uVar3;
  operation->field_0x4 = operation->field_0x4 & 0xe0;
  if (uVar3 == 0x2c00002) {
    mbedtls_cipher_init(&(operation->ctx).cmac);
  }
  else {
    if ((alg & 0x7fc00000) != 0x2800000) {
      memset(operation,0,0x168);
      return ((alg & 0x7f000000) == 0x2000000) - 0x87;
    }
    (operation->ctx).dummy = 0;
  }
  if (is_sign != 0) {
    operation->field_0x4 = operation->field_0x4 | 0x10;
  }
  pVar1 = psa_get_key_from_slot(handle,&local_38,(uint)(is_sign == 0) * 0x400 + 0x400,alg);
  if (pVar1 != 0) goto LAB_0010f743;
  if (uVar3 == 0x2c00002) {
    key_bits = (ulong)(local_38->attr).bits;
    cipher_info = mbedtls_cipher_info_from_psa
                            (0x2c00002,(local_38->attr).type,key_bits,(mbedtls_cipher_id_t *)0x0);
    if (cipher_info == (mbedtls_cipher_info_t *)0x0) {
      pVar1 = -0x86;
      goto LAB_0010f743;
    }
    operation->mac_size = (uint8_t)cipher_info->block_size;
    iVar2 = psa_cmac_setup(operation,key_bits,local_38,cipher_info);
    iVar2 = mbedtls_to_psa_error(iVar2);
  }
  else {
    iVar2 = -0x86;
    if ((alg & 0x7fc00000) == 0x2800000) {
      uVar3 = alg - 1;
      if ((0x12 < (byte)uVar3) || ((0x79f9fU >> (uVar3 & 0x1f) & 1) == 0)) {
        operation->mac_size = '\0';
        pVar1 = -0x86;
        goto LAB_0010f743;
      }
      operation->mac_size = (&DAT_0013a4e5)[uVar3 & 0xff];
      pVar1 = -0x87;
      if ((local_38->attr).type != 0x1100) goto LAB_0010f743;
      iVar2 = psa_hmac_setup_internal
                        (&(operation->ctx).hmac,(local_38->data).raw.data,(local_38->data).raw.bytes
                         ,alg & 0xff | 0x1000000);
    }
  }
  uVar3 = alg >> 8 & 0x3f;
  if (uVar3 != 0) {
    pVar1 = -0x86;
    if ((uVar3 < 4) || (pVar1 = -0x87, operation->mac_size < uVar3)) goto LAB_0010f743;
    operation->mac_size = (byte)(alg >> 8) & 0x3f;
  }
  pVar1 = iVar2;
  if (iVar2 == 0) {
    operation->field_0x4 = operation->field_0x4 | 1;
    return 0;
  }
LAB_0010f743:
  psa_mac_abort(operation);
  return pVar1;
}

Assistant:

static psa_status_t psa_mac_setup( psa_mac_operation_t *operation,
                                   psa_key_handle_t handle,
                                   psa_algorithm_t alg,
                                   int is_sign )
{
    psa_status_t status;
    psa_key_slot_t *slot;
    size_t key_bits;
    psa_key_usage_t usage =
        is_sign ? PSA_KEY_USAGE_SIGN_HASH : PSA_KEY_USAGE_VERIFY_HASH;
    uint8_t truncated = PSA_MAC_TRUNCATED_LENGTH( alg );
    psa_algorithm_t full_length_alg = PSA_ALG_FULL_LENGTH_MAC( alg );

    /* A context must be freshly initialized before it can be set up. */
    if( operation->alg != 0 )
    {
        return( PSA_ERROR_BAD_STATE );
    }

    status = psa_mac_init( operation, full_length_alg );
    if( status != PSA_SUCCESS )
        return( status );
    if( is_sign )
        operation->is_sign = 1;

    status = psa_get_transparent_key( handle, &slot, usage, alg );
    if( status != PSA_SUCCESS )
        goto exit;
    key_bits = psa_get_key_slot_bits( slot );

#if defined(MBEDTLS_CMAC_C)
    if( full_length_alg == PSA_ALG_CMAC )
    {
        const mbedtls_cipher_info_t *cipher_info =
            mbedtls_cipher_info_from_psa( full_length_alg,
                                          slot->attr.type, key_bits, NULL );
        int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
        if( cipher_info == NULL )
        {
            status = PSA_ERROR_NOT_SUPPORTED;
            goto exit;
        }
        operation->mac_size = cipher_info->block_size;
        ret = psa_cmac_setup( operation, key_bits, slot, cipher_info );
        status = mbedtls_to_psa_error( ret );
    }
    else
#endif /* MBEDTLS_CMAC_C */
#if defined(MBEDTLS_MD_C)
    if( PSA_ALG_IS_HMAC( full_length_alg ) )
    {
        psa_algorithm_t hash_alg = PSA_ALG_HMAC_GET_HASH( alg );
        if( hash_alg == 0 )
        {
            status = PSA_ERROR_NOT_SUPPORTED;
            goto exit;
        }

        operation->mac_size = PSA_HASH_SIZE( hash_alg );
        /* Sanity check. This shouldn't fail on a valid configuration. */
        if( operation->mac_size == 0 ||
            operation->mac_size > sizeof( operation->ctx.hmac.opad ) )
        {
            status = PSA_ERROR_NOT_SUPPORTED;
            goto exit;
        }

        if( slot->attr.type != PSA_KEY_TYPE_HMAC )
        {
            status = PSA_ERROR_INVALID_ARGUMENT;
            goto exit;
        }

        status = psa_hmac_setup_internal( &operation->ctx.hmac,
                                          slot->data.raw.data,
                                          slot->data.raw.bytes,
                                          hash_alg );
    }
    else
#endif /* MBEDTLS_MD_C */
    {
        (void) key_bits;
        status = PSA_ERROR_NOT_SUPPORTED;
    }

    if( truncated == 0 )
    {
        /* The "normal" case: untruncated algorithm. Nothing to do. */
    }
    else if( truncated < 4 )
    {
        /* A very short MAC is too short for security since it can be
         * brute-forced. Ancient protocols with 32-bit MACs do exist,
         * so we make this our minimum, even though 32 bits is still
         * too small for security. */
        status = PSA_ERROR_NOT_SUPPORTED;
    }
    else if( truncated > operation->mac_size )
    {
        /* It's impossible to "truncate" to a larger length. */
        status = PSA_ERROR_INVALID_ARGUMENT;
    }
    else
        operation->mac_size = truncated;

exit:
    if( status != PSA_SUCCESS )
    {
        psa_mac_abort( operation );
    }
    else
    {
        operation->key_set = 1;
    }
    return( status );
}